

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

void __thiscall
prometheus::Gateway::RegisterCollectable
          (Gateway *this,weak_ptr<prometheus::Collectable> *collectable,Labels *labels)

{
  _Base_ptr p_Var1;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  if (labels != (Labels *)0x0) {
    for (p_Var1 = (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(labels->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
      detail::encodeLabel(local_1a0,(Label *)(p_Var1 + 1));
    }
  }
  ::std::mutex::lock(&this->mutex_);
  CleanupStalePointers(&this->collectables_);
  ::std::__cxx11::stringbuf::str();
  ::std::
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>
  ::emplace_back<std::weak_ptr<prometheus::Collectable>const&,std::__cxx11::string>
            ((vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>
              *)&this->collectables_,collectable,&local_1d0);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void Gateway::RegisterCollectable(const std::weak_ptr<Collectable>& collectable,
                                  const Labels* labels) {
  std::stringstream ss;

  if (labels) {
    for (auto& label : *labels) {
      detail::encodeLabel(ss, label);
    }
  }

  std::lock_guard<std::mutex> lock{mutex_};
  CleanupStalePointers(collectables_);
  collectables_.emplace_back(collectable, ss.str());
}